

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O3

void __thiscall DummyTest_Copy_Test::TestBody(DummyTest_Copy_Test *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  AssertionResult gtest_ar;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>,_Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>_>
  p;
  Deque<int,_std::allocator<int>_> d2;
  Deque<int,_std::allocator<int>_> d;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_190;
  undefined8 local_180;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  AssertHelper local_170;
  Deque<int,_std::allocator<int>_> *local_168;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_160 [2];
  Deque<int,_std::allocator<int>_> local_140;
  Deque<int,_std::allocator<int>_> local_a8;
  
  Deque<int,_std::allocator<int>_>::Deque(&local_a8,(allocator<int> *)&local_140);
  local_140.current_._0_4_ = 0;
  do {
    Deque<int,_std::allocator<int>_>::push_back(&local_a8,(value_type *)&local_140);
    iVar1 = local_140.current_._0_4_ + 1;
    bVar3 = (int)local_140.current_._0_4_ < 99;
    local_140.current_._0_4_ = iVar1;
  } while (bVar3);
  Deque<int,_std::allocator<int>_>::Deque(&local_140,&local_a8);
  local_190.n_ = Deque<int,_std::allocator<int>_>::size(&local_a8);
  local_180 = 0;
  local_170.data_ = (AssertHelperData *)0x0;
  local_190.deque_ = &local_a8;
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
  local_168 = &local_140;
  std::
  __mismatch<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
            (local_160);
  local_190.n_ = Deque<int,_std::allocator<int>_>::size(&local_a8);
  local_190.deque_ = &local_a8;
  testing::internal::
  CmpHelperEQ<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            ((internal *)&local_180,"p.first","d.end()",local_160,&local_190);
  if (local_180._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if ((Deque<int,_std::allocator<int>_> *)local_178.ptr_ ==
        (Deque<int,_std::allocator<int>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)&(local_178.ptr_)->_M_dataplus;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
               ,0x22,pcVar6);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((long *)local_190.n_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_190.n_ != (long *)0x0)) {
        (**(code **)(*(long *)local_190.n_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar5 = ((long)(*local_a8.current_.begin_)->begin - (long)(*local_a8.current_.begin_)->buffer >>
            2) + 3;
    uVar4 = uVar5 >> 8;
    lVar8 = -local_a8.current_.allocSize_;
    if ((ulong)((long)((long)local_a8.current_.begin_ + (uVar4 * 8 - (long)local_a8.current_.arr_))
               >> 3) < local_a8.current_.allocSize_) {
      lVar8 = 0;
    }
    piVar2 = local_a8.current_.begin_[uVar4 + lVar8]->buffer;
    piVar2[(uint)uVar5 & 0xff] = 5;
    uVar4 = ((long)(*local_140.current_.begin_)->begin - (long)(*local_140.current_.begin_)->buffer
            >> 2) + 3;
    uVar7 = uVar4 >> 8;
    lVar8 = -local_140.current_.allocSize_;
    if ((ulong)((long)((long)local_140.current_.begin_ + (uVar7 * 8 - (long)local_140.current_.arr_)
                      ) >> 3) < local_140.current_.allocSize_) {
      lVar8 = 0;
    }
    testing::internal::CmpHelperNE<int,int>
              ((internal *)&local_180,"d[3]","d2[3]",piVar2 + ((uint)uVar5 & 0xff),
               (int *)((ulong)(((uint)uVar4 & 0xff) << 2) +
                      (long)local_140.current_.begin_[uVar7 + lVar8]->buffer));
    if (local_180._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if ((Deque<int,_std::allocator<int>_> *)local_178.ptr_ ==
          (Deque<int,_std::allocator<int>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)&(local_178.ptr_)->_M_dataplus;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0x25,pcVar6);
      testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      if ((long *)local_190.n_ != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)local_190.n_ != (long *)0x0)) {
          (**(code **)(*(long *)local_190.n_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  Deque<int,_std::allocator<int>_>::~Deque(&local_140);
  Deque<int,_std::allocator<int>_>::~Deque(&local_a8);
  return;
}

Assistant:

TEST(DummyTest, Copy) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
    }

    Deque<int> d2(d);
    auto p = std::mismatch(d.begin(), d.end(), d2.begin());
    ASSERT_EQ(p.first, d.end());

    d[3] = 5;
    ASSERT_NE(d[3], d2[3]);
}